

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ArrayPtr<const_unsigned_char> __thiscall
kj::BufferedInputStreamWrapper::tryGetReadBuffer(BufferedInputStreamWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  ArrayPtr<const_unsigned_char> AVar2;
  
  if ((this->bufferAvailable).size_ == 0) {
    iVar1 = (*this->inner->_vptr_InputStream[2])
                      (this->inner,(this->buffer).ptr,1,(this->buffer).size_);
    (this->bufferAvailable).ptr = (this->buffer).ptr;
    (this->bufferAvailable).size_ = CONCAT44(extraout_var,iVar1);
  }
  AVar2.ptr = (this->bufferAvailable).ptr;
  AVar2.size_ = (this->bufferAvailable).size_;
  return AVar2;
}

Assistant:

ArrayPtr<const byte> BufferedInputStreamWrapper::tryGetReadBuffer() {
  if (bufferAvailable.size() == 0) {
    size_t n = inner.tryRead(buffer.begin(), 1, buffer.size());
    bufferAvailable = buffer.slice(0, n);
  }

  return bufferAvailable;
}